

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* args::Wrap(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *in,size_type width,size_type firstlinewidth)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  pointer pcVar3;
  int iVar4;
  ulong uVar5;
  size_type firstlinewidth_00;
  long lVar6;
  bool bVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  second;
  istringstream stream;
  size_type in_stack_fffffffffffffdb8;
  allocator local_239;
  size_type local_238;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_230;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_228;
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  local_210;
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  local_1e0;
  string local_1b0 [3];
  ios_base local_138 [264];
  
  uVar5 = std::__cxx11::string::find((char)in,10);
  if (uVar5 == 0xffffffffffffffff) {
    local_238 = firstlinewidth;
    local_230 = __return_storage_ptr__;
    std::__cxx11::istringstream::istringstream((istringstream *)local_1b0,(string *)in,_S_in);
    sVar2 = in->_M_string_length;
    if (sVar2 == 0) {
      firstlinewidth_00 = 0;
    }
    else {
      pcVar3 = (in->_M_dataplus)._M_p;
      firstlinewidth_00 = 0;
      lVar6 = 0;
      do {
        iVar4 = isspace((int)pcVar3[lVar6]);
        firstlinewidth_00 = (iVar4 != 0) + firstlinewidth_00;
        if (iVar4 == 0) break;
        bVar7 = sVar2 - 1 != lVar6;
        lVar6 = lVar6 + 1;
      } while (bVar7);
    }
    std::
    istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
    ::istream_iterator(&local_1e0,(istream_type *)local_1b0);
    __return_storage_ptr__ = local_230;
    paVar1 = &local_210._M_value.field_2;
    local_210._M_stream = (istream_type *)0x0;
    local_210._M_value._M_string_length = 0;
    local_210._M_value.field_2._M_local_buf[0] = '\0';
    local_210._M_ok = false;
    local_210._M_value._M_dataplus._M_p = (pointer)paVar1;
    Wrap<std::istream_iterator<std::__cxx11::string,char,std::char_traits<char>,long>>
              (local_230,(args *)&local_1e0,&local_210,
               (istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
                *)width,local_238,firstlinewidth_00,in_stack_fffffffffffffdb8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_value._M_dataplus._M_p != paVar1) {
      operator_delete(local_210._M_value._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_value._M_dataplus._M_p != &local_1e0._M_value.field_2) {
      operator_delete(local_1e0._M_value._M_dataplus._M_p);
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
    std::ios_base::~ios_base(local_138);
  }
  else {
    std::__cxx11::string::string((string *)local_1b0,(string *)in,0,uVar5);
    Wrap(__return_storage_ptr__,local_1b0,width,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0[0]._M_dataplus._M_p != &local_1b0[0].field_2) {
      operator_delete(local_1b0[0]._M_dataplus._M_p);
    }
    std::__cxx11::string::string((string *)local_1b0,(string *)in,uVar5 + 1,&local_239);
    Wrap(&local_228,local_1b0,width,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0[0]._M_dataplus._M_p != &local_1b0[0].field_2) {
      operator_delete(local_1b0[0]._M_dataplus._M_p);
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_insert<std::move_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,
               (__return_storage_ptr__->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish,
               local_228.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_228.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_228);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<std::string> Wrap(const std::string &in, const std::string::size_type width, std::string::size_type firstlinewidth = 0)
    {
        // Preserve existing line breaks
        const auto newlineloc = in.find('\n');
        if (newlineloc != in.npos)
        {
            auto first = Wrap(std::string(in, 0, newlineloc), width);
            auto second = Wrap(std::string(in, newlineloc + 1), width);
            first.insert(
                std::end(first),
                std::make_move_iterator(std::begin(second)),
                std::make_move_iterator(std::end(second)));
            return first;
        }

        std::istringstream stream(in);
        std::string::size_type indent = 0;

        for (char c : in)
        {
            if (!isspace(c))
            {
                break;
            }
            ++indent;
        }

        return Wrap(std::istream_iterator<std::string>(stream), std::istream_iterator<std::string>(),
                    width, firstlinewidth, indent);
    }